

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDBusIntrospection::Argument>::moveAppend
          (QGenericArrayOps<QDBusIntrospection::Argument> *this,Argument *b,Argument *e)

{
  Argument *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Argument *in_RDI;
  Argument *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QDBusIntrospection::Argument>::begin
                        ((QArrayDataPointer<QDBusIntrospection::Argument> *)0x249a97);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QDBusIntrospection::Argument::Argument(this_00,in_RDI);
      local_10 = local_10 + 0x40;
      (in_RDI->type).d.d =
           (Data *)((long)&(((in_RDI->type).d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }